

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryFunctions.cpp
# Opt level: O1

string * __thiscall
helics::queryFederateSubscriptions_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,Federate *fed,string_view fedName)

{
  size_type sVar1;
  string_view target;
  string_view target_00;
  string_view queryStr;
  string_view queryStr_00;
  string local_30;
  
  target._M_str = (char *)fedName._M_len;
  target._M_len = (size_t)fed;
  queryStr._M_str = "subscriptions";
  queryStr._M_len = 0xd;
  Federate::query_abi_cxx11_
            (__return_storage_ptr__,(Federate *)this,target,queryStr,HELICS_SEQUENCING_MODE_ORDERED)
  ;
  if (2 < __return_storage_ptr__->_M_string_length) {
    sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,"error",0,5);
    if (sVar1 == 0xffffffffffffffff) {
      target_00._M_str = "gid_to_name";
      target_00._M_len = 0xb;
      queryStr_00._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
      queryStr_00._M_len = __return_storage_ptr__->_M_string_length;
      Federate::query_abi_cxx11_
                (&local_30,(Federate *)this,target_00,queryStr_00,HELICS_SEQUENCING_MODE_FAST);
      queryFederateSubscriptions_abi_cxx11_();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string queryFederateSubscriptions(helics::Federate* fed, std::string_view fedName)
{
    auto res = fed->query(fedName, "subscriptions", HELICS_SEQUENCING_MODE_ORDERED);
    if (res.size() > 2 && res.find("error") == std::string::npos) {
        res = fed->query("gid_to_name", res);
    }
    return res;
}